

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSetop.c
# Opt level: O0

DdNode * Cudd_zddSubset0(DdManager *dd,DdNode *P,int var)

{
  DdNode *pDVar1;
  DdNode *r;
  int var_local;
  DdNode *P_local;
  DdManager *dd_local;
  
  do {
    dd->reordered = 0;
    pDVar1 = cuddZddSubset0(dd,P,var);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode *
Cudd_zddSubset0(
  DdManager * dd,
  DdNode * P,
  int  var)
{
    DdNode      *r;

    do {
        dd->reordered = 0;
        r = cuddZddSubset0(dd, P, var);
    } while (dd->reordered == 1);

    return(r);

}